

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::internal::UnaryOpSquaredNorm::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,UnaryOpSquaredNorm *this,
          vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
          *u,int param_2)

{
  pointer dataPtr;
  double dVar1;
  double dVar2;
  long i;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> rm;
  Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_> um;
  assign_op<double,_double> local_139;
  vector<double,_std::allocator<double>_> local_138;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> local_118;
  MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_f8;
  Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true>
  local_d8;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_98;
  PartialReduxExpr<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::member_sum<double,_double>,_0>
  local_68;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_138,
             (long)(u->
                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(u->
                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_d8);
  dataPtr = (u->
            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase(&local_f8,(PointerType)dataPtr,2,
          (long)(u->
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)dataPtr >> 4);
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *
          )&local_118,
          local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start,1,
          (long)(u->
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(u->
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4);
  local_68.m_matrix.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_cols.m_value = local_f8.m_cols.m_value;
  local_68.m_matrix.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = local_f8.m_data;
  local_68.m_matrix.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ._8_8_ = local_f8._8_8_;
  local_98.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_cols.m_value = local_f8.m_cols.m_value;
  local_98.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = local_f8.m_data;
  local_98.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ._8_8_ = local_f8._8_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Map<Eigen::Matrix<double,2,_1,0,2,_1>const,0,Eigen::Stride<0,0>>const>const,Eigen::internal::member_sum<double,double>,0>,double,double>
            (&local_118,&local_68,&local_139);
  if (0 < local_118.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value) {
    i = 0;
    do {
      Eigen::
      Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,_-1,_0,_2,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true>
      ::Block(&local_d8,&local_98,i);
      dVar1 = local_d8.
              super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_false>
              .m_xpr.m_xpr.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[local_d8.
                      super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_false>
                      .m_startRow.m_value +
                      local_d8.
                      super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_false>
                      .m_startCol.m_value * 2];
      dVar2 = (local_d8.
               super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_false>
               .m_xpr.m_xpr.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data +
              local_d8.
              super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_false>
              .m_startRow.m_value +
              local_d8.
              super_BlockImpl<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_2,__1,_0,_2,__1>,_0,_Eigen::Stride<0,_0>_>_>,_2,_1,_true,_false>
              .m_startCol.m_value * 2)[1];
      local_118.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_data[i] = dVar2 * dVar2 + dVar1 * dVar1;
      i = i + 1;
    } while (local_118.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value != i);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    std::vector<double> result(u.size());
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {  // NOLINT
      static_assert(
          R > 0 && C > 0,
          "squaredNorm only supported for matrices with at least 1 row "
          "and column");
      if constexpr (C == 1) {  // NOLINT
        const Eigen::Map<const Eigen::Matrix<S, R, Eigen::Dynamic>> um(
            &u[0](0, 0), R, u.size());
        Eigen::Map<Eigen::Matrix<S, 1, Eigen::Dynamic>> rm(result.data(), 1,
                                                           u.size());
        rm = um.cwiseAbs2().colwise().sum();
      } else if constexpr (R == 1) {  // NOLINT
        Eigen::Map<const Eigen::Matrix<S, Eigen::Dynamic, C, Eigen::RowMajor>>
            um(&u[0](0, 0), u.size(), C);
        Eigen::Map<Eigen::Matrix<S, Eigen::Dynamic, 1>> rm(result.data(),
                                                           u.size(), 1);
        rm = um.cwiseAbs2().rowwise().sum();
      }
    } else {  // NOLINT
      for (std::size_t i = 0; i < u.size(); ++i) {
        result[i] = u[i].squaredNorm();
      }
    }
    return result;
  }